

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-checker.cc
# Opt level: O0

Result __thiscall
wabt::TypeChecker::OnIfExcept
          (TypeChecker *this,TypeVector *param_types,TypeVector *result_types,TypeVector *except_sig
          )

{
  Result rhs;
  TypeVector *except_sig_local;
  TypeVector *result_types_local;
  TypeVector *param_types_local;
  TypeChecker *this_local;
  Result result;
  
  this_local._4_4_ = PopAndCheck1Type(this,ExceptRef,"if_except");
  rhs = PopAndCheckSignature(this,param_types,"if_except");
  Result::operator|=((Result *)((long)&this_local + 4),rhs);
  PushLabel(this,IfExcept,param_types,result_types);
  PushTypes(this,param_types);
  PushTypes(this,except_sig);
  return (Result)this_local._4_4_;
}

Assistant:

Result TypeChecker::OnIfExcept(const TypeVector& param_types,
                               const TypeVector& result_types,
                               const TypeVector& except_sig) {
  Result result = PopAndCheck1Type(Type::ExceptRef, "if_except");
  result |= PopAndCheckSignature(param_types, "if_except");
  PushLabel(LabelType::IfExcept, param_types, result_types);
  // TODO(binji): Not quite sure how multi-value and exception proposals are
  // meant to interact here.
  PushTypes(param_types);
  PushTypes(except_sig);
  return result;
}